

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2013.hpp
# Opt level: O0

void bcl::st2013::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  reference pdVar1;
  reference pvVar2;
  const_reference pvVar3;
  double *pdVar4;
  reference pvVar5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar6;
  double t;
  size_t j_1;
  size_t i_2;
  size_t j;
  size_t i_1;
  size_t i;
  double shift;
  double sum;
  vector<double,_std::allocator<double>_> accum;
  size_t n;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  double in_stack_fffffffffffffe30;
  value_type vVar7;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe38;
  double dVar8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  size_type local_100;
  ulong local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  ulong local_a0;
  ulong local_98;
  size_type local_90;
  double *local_88;
  double *local_80;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  double local_70;
  double *local_68;
  double *local_60;
  double local_58;
  undefined8 local_38;
  vector<double,_std::allocator<double>_> local_30;
  size_type local_18;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_38 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x103670);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48._M_current,
             in_stack_fffffffffffffe40._M_current,
             (allocator_type *)in_stack_fffffffffffffe38._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x1036a4);
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
  local_68 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
  local_58 = std::
             accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                       (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                        in_stack_fffffffffffffe30);
  local_80 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
  local_88 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
  local_78 = std::
             max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                       (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  pdVar1 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_78);
  local_70 = *pdVar1 / local_58;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0);
  *pvVar2 = 0.0;
  for (local_90 = 0; local_90 < local_18; local_90 = local_90 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_90);
    dVar8 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_90);
    dVar6 = *pvVar3 / local_58;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_90 + 1);
    *pvVar2 = dVar8 + dVar6;
  }
  for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
    for (local_a0 = 0; local_a0 < local_18; local_a0 = local_a0 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_98 + 1);
      local_b0 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_a0 + 1);
      pdVar4 = std::min<double>(&local_b0,pvVar2);
      dVar8 = *pdVar4;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_98);
      local_b8 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_a0);
      pdVar4 = std::max<double>(&local_b8,pvVar2);
      local_a8 = dVar8 - *pdVar4;
      local_c0 = 0.0;
      pdVar4 = std::max<double>(&local_a8,&local_c0);
      dVar8 = *pdVar4;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_98 + 1);
      local_d0 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_a0 + 1);
      local_d8 = *pvVar2 + 1.0;
      pdVar4 = std::min<double>(&local_d0,&local_d8);
      dVar6 = *pdVar4;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_98);
      local_e0 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_a0);
      local_e8 = *pvVar2 + 1.0;
      pdVar4 = std::max<double>(&local_e0,&local_e8);
      local_c8 = dVar6 - *pdVar4;
      local_f0 = 0.0;
      pdVar4 = std::max<double>(&local_c8,&local_f0);
      dVar6 = *pdVar4;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_10,local_98);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_a0);
      *pvVar2 = dVar8 + dVar6;
    }
  }
  for (local_f8 = 0; local_f8 < local_18; local_f8 = local_f8 + 1) {
    for (local_100 = local_f8; local_100 < local_18; local_100 = local_100 + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_10,local_f8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_100);
      vVar7 = *pvVar2;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_10,local_100);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_f8);
      dVar6 = (vVar7 + *pvVar2) / 2.0;
      dVar8 = dVar6;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_f8);
      in_stack_fffffffffffffe40._M_current = (double *)(dVar8 / (*pvVar3 / local_58));
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_10,local_f8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_100);
      *pvVar2 = (value_type)in_stack_fffffffffffffe40._M_current;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_100);
      dVar6 = dVar6 / (*pvVar3 / local_58);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_10,local_100);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_f8);
      *pvVar2 = dVar6;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40._M_current);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0));
      }
    }
    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = i; j < n; ++j) {
        double t = (tm[i][j] + tm[j][i]) / 2;
        tm[i][j] = t / (weights[i] / sum);
        tm[j][i] = t / (weights[j] / sum);
      }
    }
  }